

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

char * cmdlineparse(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  allocator local_59;
  long *local_58 [2];
  long local_48 [2];
  int local_34;
  
  iVar1 = 0;
  local_34 = argc;
  if (1 < argc) {
    iVar4 = 1;
    iVar5 = 0;
    do {
      std::__cxx11::string::string((string *)local_58,argv[iVar4],&local_59);
      iVar2 = std::__cxx11::string::compare((char *)local_58);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      iVar1 = iVar5;
      if (iVar2 == 0) {
        console.loglevel = 2;
      }
      else {
        std::__cxx11::string::string((string *)local_58,argv[iVar4],&local_59);
        iVar2 = std::__cxx11::string::compare((char *)local_58);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        if (iVar2 == 0) {
          opt_preview = true;
        }
        else {
          std::__cxx11::string::string((string *)local_58,argv[iVar4],&local_59);
          iVar2 = std::__cxx11::string::compare((char *)local_58);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          if (iVar2 == 0) {
            opt_albedo = true;
          }
          else {
            std::__cxx11::string::string((string *)local_58,argv[iVar4],&local_59);
            iVar2 = std::__cxx11::string::compare((char *)local_58);
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
            if (iVar2 == 0) {
              opt_normal = true;
            }
            else {
              std::__cxx11::string::string((string *)local_58,argv[iVar4],&local_59);
              iVar2 = std::__cxx11::string::compare((char *)local_58);
              if (local_58[0] != local_48) {
                operator_delete(local_58[0],local_48[0] + 1);
              }
              iVar1 = iVar4;
              if (iVar2 == 0) {
                opt_spp = atoi(argv[(long)iVar4 + 1]);
                iVar4 = iVar4 + 1;
                iVar1 = iVar5;
              }
            }
          }
        }
      }
      iVar4 = iVar4 + 1;
      iVar5 = iVar1;
    } while (iVar4 < local_34);
  }
  if (iVar1 == 0) {
    github111116::ConsoleLogger::info<char[7],char*,char[23]>
              (&console,(char (*) [7])"Usage:",argv,(char (*) [23])"[options] <scene json>");
    github111116::ConsoleLogger::log<char[9]>(&console,(char (*) [9])"Options:");
    github111116::ConsoleLogger::log<char[49]>
              (&console,(char (*) [49])"  --quiet          Only show warnings and errors");
    github111116::ConsoleLogger::log<char[45]>
              (&console,(char (*) [45])"  --preview        Render with lower quality");
    github111116::ConsoleLogger::log<char[51]>
              (&console,(char (*) [51])"  --spp <n>        Render with n samples per pixel");
    github111116::ConsoleLogger::log<char[61]>
              (&console,(char (*) [61])
                        "  --albedo         Output albedo buffer to albedo-[filename]");
    github111116::ConsoleLogger::log<char[61]>
              (&console,(char (*) [61])
                        "  --normal         Output normal buffer to normal-[filename]");
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "scene not specified.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  return argv[iVar1];
}

Assistant:

const char* cmdlineparse(int argc, char* argv[]) {
#ifndef NDEBUG
	console.warn("Running in DEBUG mode. EXTREMELY SLOW!\n");
#endif
	int fileno = 0;
	for (int i=1; i<argc; ++i) {
		if (std::string(argv[i]) == "--quiet")
			console.loglevel = 2;
		else if (std::string(argv[i]) == "--preview")
			opt_preview = true;
		else if (std::string(argv[i]) == "--albedo")
			opt_albedo = true;
		else if (std::string(argv[i]) == "--normal")
			opt_normal = true;
		else if (std::string(argv[i]) == "--spp")
			opt_spp = atoi(argv[++i]);
		else {
			fileno = i;
		}
	}
	if (!fileno) {
		console.info("Usage:", argv[0], "[options] <scene json>");
		console.log ("Options:");
		console.log ("  --quiet          Only show warnings and errors");
		console.log ("  --preview        Render with lower quality");
		console.log ("  --spp <n>        Render with n samples per pixel");
		console.log ("  --albedo         Output albedo buffer to albedo-[filename]");
		console.log ("  --normal         Output normal buffer to normal-[filename]");
		throw "scene not specified.";
	}
	return argv[fileno];
}